

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int g_read(lua_State *L,FILE *f,int first)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  lconv *plVar10;
  ushort **ppuVar11;
  int idx;
  uint hex;
  bool bVar12;
  int local_2074;
  luaL_Buffer local_2050;
  
  iVar3 = lua_gettop(L);
  clearerr((FILE *)f);
  if (iVar3 == 1) {
    uVar4 = read_line(L,f,1);
    idx = first + 1;
  }
  else {
    luaL_checkstack(L,iVar3 + 0x13,"too many arguments");
    iVar3 = iVar3 + -2;
    idx = first;
    do {
      iVar5 = lua_type(L,idx);
      if (iVar5 == 3) {
        sVar7 = luaL_checkinteger(L,idx);
        if (sVar7 == 0) {
          iVar5 = getc((FILE *)f);
          ungetc(iVar5,(FILE *)f);
          lua_pushstring(L,"");
          bVar12 = iVar5 == -1;
        }
        else {
          luaL_buffinit(L,&local_2050);
          pcVar8 = luaL_prepbuffsize(&local_2050,sVar7);
          sVar9 = fread(pcVar8,1,sVar7,(FILE *)f);
          local_2050.n = local_2050.n + sVar9;
          luaL_pushresult(&local_2050);
          bVar12 = sVar9 == 0;
        }
        uVar4 = (uint)!bVar12;
      }
      else {
        pcVar8 = luaL_checklstring(L,idx,(size_t *)0x0);
        bVar1 = pcVar8[*pcVar8 == '*'];
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            iVar5 = 0;
LAB_001166fc:
            uVar4 = read_line(L,f,iVar5);
            goto LAB_0011680e;
          }
          if (bVar1 == 0x61) {
            luaL_buffinit(L,&local_2050);
            do {
              pcVar8 = luaL_prepbuffsize(&local_2050,0x2000);
              sVar9 = fread(pcVar8,1,0x2000,(FILE *)f);
              local_2050.n = local_2050.n + sVar9;
            } while (sVar9 == 0x2000);
            luaL_pushresult(&local_2050);
            bVar12 = true;
            uVar4 = 1;
          }
          else {
LAB_001166c6:
            local_2074 = luaL_argerror(L,idx,"invalid format");
            uVar4 = 1;
            bVar12 = false;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            iVar5 = 1;
            goto LAB_001166fc;
          }
          if (bVar1 != 0x6e) goto LAB_001166c6;
          local_2050.size._4_4_ = 0;
          local_2050.b = (char *)f;
          plVar10 = localeconv();
          cVar2 = *plVar10->decimal_point;
          do {
            uVar4 = getc((FILE *)local_2050.b);
            local_2050.size._0_4_ = uVar4;
            ppuVar11 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar11 + (long)(int)uVar4 * 2 + 1) & 0x20) != 0);
          if ((uVar4 == 0x2d) || (uVar4 == 0x2b)) {
            nextc((RN *)&local_2050);
          }
          uVar4 = 0;
          if ((uint)local_2050.size == 0x30) {
            iVar5 = nextc((RN *)&local_2050);
            pcVar8 = "eE";
            hex = 0;
            if (iVar5 != 0) {
              if (((uint)local_2050.size | 0x20) == 0x78) {
                iVar5 = nextc((RN *)&local_2050);
                bVar12 = iVar5 == 0;
              }
              else {
                bVar12 = true;
              }
              uVar4 = (uint)bVar12;
              pcVar8 = "pP";
              if (bVar12 != false) {
                pcVar8 = "eE";
              }
              hex = (uint)(bVar12 ^ 1);
            }
          }
          else {
            pcVar8 = "eE";
            hex = 0;
          }
          iVar5 = readdigits((RN *)&local_2050,hex);
          iVar5 = iVar5 + uVar4;
          if (((uint)local_2050.size == (int)cVar2 || (uint)local_2050.size == 0x2e) &&
             (iVar6 = nextc((RN *)&local_2050), iVar6 != 0)) {
            iVar6 = readdigits((RN *)&local_2050,hex);
            iVar5 = iVar5 + iVar6;
          }
          if ((0 < iVar5) &&
             ((((uint)local_2050.size == (int)*pcVar8 || ((uint)local_2050.size == (int)pcVar8[1]))
              && (iVar5 = nextc((RN *)&local_2050), iVar5 != 0)))) {
            if (((uint)local_2050.size == 0x2d) || ((uint)local_2050.size == 0x2b)) {
              nextc((RN *)&local_2050);
            }
            readdigits((RN *)&local_2050,0);
          }
          ungetc((uint)local_2050.size,(FILE *)local_2050.b);
          local_2050.initb[(long)local_2050.size._4_4_ + -0x10] = '\0';
          sVar7 = lua_stringtonumber(L,(char *)&local_2050.n);
          uVar4 = 1;
          if (sVar7 == 0) {
            lua_pushnil(L);
            uVar4 = 0;
          }
LAB_0011680e:
          bVar12 = true;
        }
        if (!bVar12) {
          return local_2074;
        }
      }
      idx = idx + 1;
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((bVar12) && (uVar4 != 0));
  }
  iVar3 = ferror((FILE *)f);
  if (iVar3 == 0) {
    if (uVar4 == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    local_2074 = idx - first;
  }
  else {
    local_2074 = luaL_fileresult(L,0,(char *)0x0);
  }
  return local_2074;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int success;
  int n;
  clearerr(f);
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first+1;  /* to return 1 result */
  }
  else {  /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    lua_pushnil(L);  /* push nil instead */
  }
  return n - first;
}